

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# renderer.cpp
# Opt level: O1

Color __thiscall Renderer::radiance(Renderer *this,Ray ray,Sampler *sampler)

{
  Light *pLVar1;
  BSDF *this_00;
  pointer ppLVar2;
  bool bVar3;
  double dVar4;
  undefined1 auVar5 [16];
  int iVar6;
  pointer ppLVar7;
  ulong uVar8;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float extraout_XMM0_Da_01;
  float fVar9;
  float extraout_XMM0_Da_02;
  float extraout_XMM0_Da_03;
  float extraout_XMM0_Da_04;
  float extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  float extraout_XMM0_Db_01;
  float extraout_XMM0_Db_02;
  float extraout_XMM0_Db_03;
  float extraout_XMM0_Dc;
  float extraout_XMM0_Dc_00;
  float extraout_XMM0_Dc_01;
  float extraout_XMM0_Dc_02;
  float extraout_XMM0_Dc_03;
  float extraout_XMM0_Dd;
  float extraout_XMM0_Dd_00;
  float extraout_XMM0_Dd_01;
  float extraout_XMM0_Dd_02;
  float extraout_XMM0_Dd_03;
  float fVar10;
  Color CVar11;
  float dist;
  Ray shadowray;
  HitInfo hit;
  HitInfo shadowhit;
  float local_190;
  char local_189;
  undefined8 local_188;
  undefined8 uStack_180;
  float local_16c;
  undefined8 local_168;
  float local_160;
  float local_158;
  undefined4 uStack_154;
  undefined4 uStack_150;
  undefined4 uStack_14c;
  undefined1 local_148 [8];
  float fStack_140;
  float fStack_13c;
  Sampler *local_138;
  float local_12c;
  undefined8 local_128;
  float local_120;
  undefined8 local_11c;
  float local_114;
  ulong local_110;
  undefined8 local_108;
  undefined8 uStack_100;
  HitInfo local_f8;
  undefined8 local_a8;
  float local_a0;
  float local_9c;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  local_189 = '\x01';
  if (-1 < this->max_bounces) {
    _local_148 = ZEXT816(0x3f8000003f800000);
    fVar10 = 1.0;
    local_188 = 0;
    uStack_180 = 0;
    uVar8 = 0;
    local_190 = 0.0;
    local_158 = 1.0;
    uStack_154 = 0;
    uStack_150 = 0;
    uStack_14c = 0;
    local_138 = sampler;
    do {
      (**this->acc->_vptr_Accelarator)(&local_f8,this->acc,&ray);
      if (local_f8.super_Hit.hit == false) {
        ppLVar7 = (this->global_lights).super__Vector_base<Light_*,_std::allocator<Light_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        ppLVar2 = (this->global_lights).super__Vector_base<Light_*,_std::allocator<Light_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        if (ppLVar7 == ppLVar2) goto LAB_0011cc3a;
        do {
          (*(*ppLVar7)->_vptr_Light[1])(*ppLVar7,&ray);
          local_190 = local_190 + fVar10 * local_158;
          local_188._0_4_ = (float)local_188 + extraout_XMM0_Da_04 * (float)local_148._0_4_;
          local_188._4_4_ = local_188._4_4_ + extraout_XMM0_Db_03 * (float)local_148._4_4_;
          uStack_180._0_4_ = (float)uStack_180 + extraout_XMM0_Dc_03 * fStack_140;
          uStack_180._4_4_ = uStack_180._4_4_ + extraout_XMM0_Dd_03 * fStack_13c;
          ppLVar7 = ppLVar7 + 1;
          fVar10 = (float)local_188;
        } while (ppLVar7 != ppLVar2);
        goto LAB_0011cc4b;
      }
      pLVar1 = (local_f8.object)->emission;
      if ((pLVar1 != (Light *)0x0) && ((local_189 != '\0' || (pLVar1->samplable == false)))) {
        (*pLVar1->_vptr_Light[1])(pLVar1,&ray);
        fVar10 = fVar10 * local_158;
        local_188 = CONCAT44(local_188._4_4_ + extraout_XMM0_Db * (float)local_148._4_4_,
                             (float)local_188 + extraout_XMM0_Da * (float)local_148._0_4_);
        uStack_180 = CONCAT44(uStack_180._4_4_ + extraout_XMM0_Dd * fStack_13c,
                              (float)uStack_180 + extraout_XMM0_Dc * fStack_140);
        local_190 = local_190 + fVar10;
      }
      this_00 = (local_f8.object)->bsdf;
      if (this_00 == (BSDF *)0x0) {
LAB_0011cc3a:
        goto LAB_0011cc4b;
      }
      local_110 = uVar8;
      BSDF::bump(this_00,&local_f8);
      ppLVar2 = (this->samplable_lights).super__Vector_base<Light_*,_std::allocator<Light_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      for (ppLVar7 = (this->samplable_lights).super__Vector_base<Light_*,_std::allocator<Light_*>_>.
                     _M_impl.super__Vector_impl_data._M_start; ppLVar7 != ppLVar2;
          ppLVar7 = ppLVar7 + 1) {
        local_168 = 0;
        local_160 = 0.0;
        (**(*ppLVar7)->_vptr_Light)(*ppLVar7,&local_f8.super_Hit.p,&local_168,&local_16c,local_138);
        local_108 = CONCAT44(local_108._4_4_,fVar10);
        fVar10 = -ray.dir.z;
        local_a8 = ray.dir._0_8_ ^ 0x8000000080000000;
        local_a0 = fVar10;
        local_48 = extraout_XMM0_Da_00;
        fStack_44 = extraout_XMM0_Db_00;
        fStack_40 = extraout_XMM0_Dc_00;
        fStack_3c = extraout_XMM0_Dd_00;
        (**this_00->_vptr_BSDF)(this_00,&local_a8,&local_168,&local_f8);
        if ((((extraout_XMM0_Da_01 != 0.0) || (extraout_XMM0_Db_01 != 0.0)) ||
            (NAN(extraout_XMM0_Db_01))) || ((fVar10 != 0.0 || (NAN(fVar10))))) {
          fVar9 = this->geoEPS;
          local_16c = local_16c - fVar9;
          local_120 = fVar9 * local_160 + local_f8.super_Hit.p.z;
          local_128 = CONCAT44(local_f8.super_Hit.p.y + fVar9 * (float)((ulong)local_168 >> 0x20),
                               local_f8.super_Hit.p.x + fVar9 * (float)local_168);
          local_11c = local_168;
          local_114 = local_160;
          local_12c = fVar10;
          local_58 = extraout_XMM0_Da_01;
          fStack_54 = extraout_XMM0_Db_01;
          fStack_50 = extraout_XMM0_Dc_01;
          fStack_4c = extraout_XMM0_Dd_01;
          (**this->acc->_vptr_Accelarator)(&local_a8,this->acc,&local_128);
          if ((char)local_a8 == '\x01') {
            fVar9 = (local_9c - local_120) * (local_9c - local_120) +
                    (local_a8._4_4_ - (float)local_128) * (local_a8._4_4_ - (float)local_128) +
                    (local_a0 - local_128._4_4_) * (local_a0 - local_128._4_4_);
            if (fVar9 < 0.0) {
              fVar9 = sqrtf(fVar9);
            }
            else {
              fVar9 = SQRT(fVar9);
            }
            fVar10 = (1.0 - this->geoEPS) * local_16c;
            if (fVar9 <= fVar10) goto LAB_0011c96b;
          }
          fVar9 = ABS(local_f8.super_Hit.Ns.z * local_160 +
                      local_f8.super_Hit.Ns.x * (float)local_168 +
                      local_f8.super_Hit.Ns.y * local_168._4_4_);
          fVar10 = local_48 * (float)local_148._0_4_ * local_58;
          local_188 = CONCAT44(local_188._4_4_ +
                               fVar9 * fStack_44 * (float)local_148._4_4_ * fStack_54,
                               (float)local_188 + fVar9 * fVar10);
          uStack_180 = CONCAT44(uStack_180._4_4_ + fVar9 * fStack_3c * fStack_13c * fStack_4c,
                                (float)uStack_180 + fVar9 * fStack_40 * fStack_140 * fStack_50);
          local_190 = local_190 + (float)local_108 * local_158 * local_12c * fVar9;
        }
LAB_0011c96b:
      }
      local_a8 = 0;
      local_a0 = 0.0;
      fVar10 = -ray.dir.z;
      local_128 = ray.dir._0_8_ ^ 0x8000000080000000;
      local_120 = fVar10;
      (*this_00->_vptr_BSDF[1])(this_00,&local_128,&local_a8,&local_f8,&local_189,local_138);
      fVar9 = ABS(local_a0 * local_f8.super_Hit.Ns.z +
                  (float)local_a8 * local_f8.super_Hit.Ns.x +
                  local_a8._4_4_ * local_f8.super_Hit.Ns.y);
      local_148._0_4_ = (float)local_148._0_4_ * fVar9 * extraout_XMM0_Da_02;
      local_148._4_4_ = (float)local_148._4_4_ * fVar9 * extraout_XMM0_Db_02;
      local_158 = local_158 * fVar10 * fVar9;
      if (((((float)local_148._0_4_ == 0.0) && (!NAN((float)local_148._0_4_))) &&
          (((float)local_148._4_4_ == 0.0 &&
           (((!NAN((float)local_148._4_4_) && (local_158 == 0.0)) && (!NAN(local_158))))))) ||
         (1e+20 <= local_158 * local_158 +
                   (float)local_148._0_4_ * (float)local_148._0_4_ +
                   (float)local_148._4_4_ * (float)local_148._4_4_)) goto LAB_0011cc50;
      fVar10 = (float)local_148._4_4_;
      if ((float)local_148._4_4_ <= (float)local_148._0_4_) {
        fVar10 = (float)local_148._0_4_;
      }
      fStack_140 = fStack_140 * fVar9 * extraout_XMM0_Dc_02;
      fStack_13c = fStack_13c * fVar9 * extraout_XMM0_Dd_02;
      fVar9 = (float)(~-(uint)NAN((float)local_148._0_4_) & (uint)fVar10 |
                     -(uint)NAN((float)local_148._0_4_) & local_148._4_4_);
      fVar10 = local_158;
      if (local_158 <= fVar9) {
        fVar10 = fVar9;
      }
      dVar4 = (double)(float)(-(uint)NAN(fVar9) & (uint)local_158 |
                             ~-(uint)NAN(fVar9) & (uint)fVar10);
      if (0.1 <= dVar4) {
        iVar6 = (int)local_110;
LAB_0011cb61:
        fVar10 = this->geoEPS;
        ray.origin.z = fVar10 * local_a0 + local_f8.super_Hit.p.z;
        ray.origin.y = local_f8.super_Hit.p.y + fVar10 * (float)(local_a8 >> 0x20);
        ray.origin.x = local_f8.super_Hit.p.x + fVar10 * (float)local_a8;
        ray.dir.x = (float)local_a8;
        ray.dir.y = local_a8._4_4_;
        ray.dir.z = local_a0;
        bVar3 = false;
        fVar10 = local_a0;
      }
      else {
        dVar4 = dVar4 / 0.3;
        local_108 = CONCAT44((int)((ulong)dVar4 >> 0x20),(float)dVar4);
        uStack_100 = 0;
        (**local_138->_vptr_Sampler)();
        bVar3 = (float)local_108 <= extraout_XMM0_Da_03;
        iVar6 = (int)local_110;
        if (extraout_XMM0_Da_03 < (float)local_108) {
          auVar5._4_4_ = (float)local_108;
          auVar5._0_4_ = (float)local_108;
          auVar5._8_4_ = (float)local_108;
          auVar5._12_4_ = (float)local_108;
          _local_148 = divps(_local_148,auVar5);
        }
        fVar10 = (float)((uint)(local_158 / (float)local_108) &
                        -(uint)(extraout_XMM0_Da_03 < (float)local_108));
        local_158 = (float)(~-(uint)(extraout_XMM0_Da_03 < (float)local_108) & (uint)local_158 |
                           (uint)fVar10);
        if (extraout_XMM0_Da_03 < (float)local_108) goto LAB_0011cb61;
      }
      if ((bVar3) || (uVar8 = (ulong)(iVar6 + 1), this->max_bounces <= iVar6)) goto LAB_0011cc50;
    } while( true );
  }
  local_190 = 0.0;
  local_188._0_4_ = 0.0;
  local_188._4_4_ = 0.0;
LAB_0011cc4b:
LAB_0011cc50:
  CVar11.z = local_190;
  CVar11.x = (float)local_188;
  CVar11.y = local_188._4_4_;
  return CVar11;
}

Assistant:

Color Renderer::radiance(Ray ray, Sampler& sampler)
{
	Color through(1);
	Color result;
	bool lastDirac = true; // accept all light sources if directly into camera
	for (int nbounce = 0; nbounce <= max_bounces; nbounce++)
	{
		HitInfo hit = acc->hit(ray);
		if (!hit) {
			for (Light* l: global_lights)
				result += through * l->radiance(ray);
			break;
		}
		if (hit.object->emission) {
			if (lastDirac || !hit.object->emission->samplable)
				result += through * hit.object->emission->radiance(ray);
		}
		BSDF* bsdf = hit.object->bsdf;
		if (!bsdf) break;
		bsdf->bump(hit);
		// direct light
		for (Light* l: samplable_lights) {
			vec3f dirToLight;
			float dist;
			Color irr = l->sampleIrradiance(hit.p, dirToLight, dist, sampler);
			Color f = bsdf->f(-ray.dir, dirToLight, hit);
			if (f == vec3f(0)) continue;
			dist -= geoEPS; // cancel amount that ray origin is moved forward
			// shadow ray test
			Ray shadowray(hit.p + geoEPS * dirToLight, dirToLight);
			HitInfo shadowhit = acc->hit(shadowray);
			if (!shadowhit || norm(shadowhit.p - shadowray.origin) > (1-geoEPS) * dist)
				result += through * irr * f * fabs(dot(hit.Ns, dirToLight));
		}
		// indirect light (bsdf importance sampling)
		vec3f newdir;
		Color f = bsdf->sample_f(-ray.dir, newdir, hit, lastDirac, sampler); // already scaled by 1/pdf
		through *= fabs(dot(newdir, hit.Ns)) * f;
		if (through == vec3f() || !(sqrlen(through) < 1e20)) break;
		// russian roulette
		float t = fmax(fmax(through.x, through.y), through.z);
		if (t < 0.1) {
			float p = t / 0.3;
			if (sampler.get1f() >= p) break;
			through = through / p;
		}
		ray = Ray(hit.p + geoEPS*newdir, newdir);
	}
	return result;
}